

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O0

int light_pcapng_to_file(char *file_name,light_pcapng pcapng)

{
  uint32_t *__ptr;
  __fd_t in_RSI;
  __fd_t fd;
  uint32_t *data;
  size_t size;
  size_t *in_stack_00000030;
  light_pcapng in_stack_00000038;
  undefined4 in_stack_ffffffffffffffe8;
  __read_mode_t in_stack_ffffffffffffffec;
  
  __ptr = light_pcapng_to_memory(in_stack_00000038,in_stack_00000030);
  light_open((char *)in_RSI,in_stack_ffffffffffffffec);
  light_write(in_RSI,(void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
              (size_t)__ptr);
  light_close((__fd_t)0x102531);
  free(__ptr);
  return 0;
}

Assistant:

int light_pcapng_to_file(const char *file_name, const light_pcapng pcapng)
{
	size_t size;
	uint32_t *data = light_pcapng_to_memory(pcapng, &size);
	__fd_t fd = light_open(file_name, LIGHT_OWRITE);

	light_write(fd, data, size);
	light_close(fd);
	free(data);
	return LIGHT_SUCCESS;
}